

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O0

RealType __thiscall OpenMD::SC::getAlpha(SC *this,AtomType *atomType1,AtomType *atomType2)

{
  bool bVar1;
  AtomType *in_RDX;
  AtomType *in_RSI;
  locale *in_RDI;
  string DistanceMix;
  ForceFieldOptions *fopts;
  RealType alpha2;
  RealType alpha1;
  SuttonChenAdapter sca2;
  SuttonChenAdapter sca1;
  ForceFieldOptions *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  SuttonChenAdapter *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cont;
  locale local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ForceFieldOptions *local_48;
  RealType local_40;
  RealType local_38;
  SuttonChenAdapter local_30;
  SuttonChenAdapter local_28;
  AtomType *local_20;
  double local_8;
  
  local_20 = in_RDX;
  SuttonChenAdapter::SuttonChenAdapter(&local_28,in_RSI);
  SuttonChenAdapter::SuttonChenAdapter(&local_30,local_20);
  local_38 = SuttonChenAdapter::getAlpha(in_stack_ffffffffffffff70);
  local_40 = SuttonChenAdapter::getAlpha(in_stack_ffffffffffffff70);
  local_48 = ForceField::getForceFieldOptions(*(ForceField **)(in_RDI + 0xb0));
  cont = &local_68;
  ForceFieldOptions::getDistanceMixingRule_abi_cxx11_(in_stack_ffffffffffffff48);
  std::locale::locale(local_70);
  toUpper<std::__cxx11::string>(cont,in_RDI);
  std::locale::~locale(local_70);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          (char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    local_8 = sqrt(local_38 * local_40);
  }
  else {
    local_8 = (local_38 + local_40) * 0.5;
  }
  std::__cxx11::string::~string((string *)&local_68);
  return local_8;
}

Assistant:

RealType SC::getAlpha(AtomType* atomType1, AtomType* atomType2) {
    SuttonChenAdapter sca1 = SuttonChenAdapter(atomType1);
    SuttonChenAdapter sca2 = SuttonChenAdapter(atomType2);
    RealType alpha1        = sca1.getAlpha();
    RealType alpha2        = sca2.getAlpha();

    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
    std::string DistanceMix  = fopts.getDistanceMixingRule();
    toUpper(DistanceMix);

    if (DistanceMix == "GEOMETRIC")
      return sqrt(alpha1 * alpha2);
    else
      return 0.5 * (alpha1 + alpha2);
  }